

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O0

SRes LookToRead_Read(void *pp,void *buf,size_t *size)

{
  ulong *in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t rem;
  CLookToRead *p;
  undefined8 local_30;
  undefined4 local_4;
  
  local_30 = *(long *)(in_RDI + 0x30) - *(long *)(in_RDI + 0x28);
  if (local_30 == 0) {
    local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x20))
                        (*(undefined8 *)(in_RDI + 0x20),in_RSI,in_RDX);
  }
  else {
    if (*in_RDX < local_30) {
      local_30 = *in_RDX;
    }
    memcpy(in_RSI,(void *)(in_RDI + 0x38 + *(long *)(in_RDI + 0x28)),local_30);
    *(ulong *)(in_RDI + 0x28) = local_30 + *(long *)(in_RDI + 0x28);
    *in_RDX = local_30;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static SRes LookToRead_Read(void *pp, void *buf, size_t *size)
{
  CLookToRead *p = (CLookToRead *)pp;
  size_t rem = p->size - p->pos;
  if (rem == 0)
    return p->realStream->Read(p->realStream, buf, size);
  if (rem > *size)
    rem = *size;
  memcpy(buf, p->buf + p->pos, rem);
  p->pos += rem;
  *size = rem;
  return SZ_OK;
}